

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss.cpp
# Opt level: O1

void __thiscall edk2_vss_t::_read(edk2_vss_t *this)

{
  kstream *pkVar1;
  vss_store_body_t *pvVar2;
  uint8_t uVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  int iVar6;
  kstream *this_00;
  vss_store_body_t *this_01;
  validation_expr_error<unsigned_int> *this_02;
  uint uVar7;
  pointer __p;
  string local_60;
  string local_40;
  
  uVar5 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_signature = uVar5;
  uVar5 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_vss_size = uVar5;
  if (this->f_len_vss_store_header == true) {
    uVar7 = (uint)this->m_len_vss_store_header;
  }
  else {
    this->f_len_vss_store_header = true;
    this->m_len_vss_store_header = '\x10';
    uVar7 = 0x10;
  }
  if ((uVar5 != 0xffffffff) && (uVar7 < uVar5)) {
    uVar3 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_format = uVar3;
    uVar3 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_state = uVar3;
    uVar4 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
    this->m_reserved = uVar4;
    uVar5 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_reserved1 = uVar5;
    pkVar1 = (this->super_kstruct).m__io;
    if (this->f_len_vss_store_header == true) {
      iVar6 = (int)this->m_len_vss_store_header;
    }
    else {
      this->f_len_vss_store_header = true;
      this->m_len_vss_store_header = '\x10';
      iVar6 = 0x10;
    }
    kaitai::kstream::read_bytes_abi_cxx11_(&local_60,pkVar1,(ulong)(this->m_vss_size - iVar6));
    std::__cxx11::string::operator=((string *)&this->m__raw_body,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    this_00 = (kstream *)operator_new(0x198);
    kaitai::kstream::kstream(this_00,&this->m__raw_body);
    local_60._M_dataplus._M_p = (pointer)0x0;
    pkVar1 = (this->m__io__raw_body)._M_t.
             super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
             super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
             super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl;
    (this->m__io__raw_body)._M_t.
    super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
    super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
    super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl = this_00;
    if (pkVar1 != (kstream *)0x0) {
      std::default_delete<kaitai::kstream>::operator()
                ((default_delete<kaitai::kstream> *)&this->m__io__raw_body,pkVar1);
    }
    if ((kstream *)local_60._M_dataplus._M_p != (kstream *)0x0) {
      std::default_delete<kaitai::kstream>::operator()
                ((default_delete<kaitai::kstream> *)&local_60,(kstream *)local_60._M_dataplus._M_p);
    }
    this_01 = (vss_store_body_t *)operator_new(0x28);
    vss_store_body_t::vss_store_body_t
              (this_01,(this->m__io__raw_body)._M_t.
                       super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>
                       .super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl,this,
               this->m__root);
    pvVar2 = (this->m_body)._M_t.
             super___uniq_ptr_impl<edk2_vss_t::vss_store_body_t,_std::default_delete<edk2_vss_t::vss_store_body_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_edk2_vss_t::vss_store_body_t_*,_std::default_delete<edk2_vss_t::vss_store_body_t>_>
             .super__Head_base<0UL,_edk2_vss_t::vss_store_body_t_*,_false>._M_head_impl;
    (this->m_body)._M_t.
    super___uniq_ptr_impl<edk2_vss_t::vss_store_body_t,_std::default_delete<edk2_vss_t::vss_store_body_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_edk2_vss_t::vss_store_body_t_*,_std::default_delete<edk2_vss_t::vss_store_body_t>_>
    .super__Head_base<0UL,_edk2_vss_t::vss_store_body_t_*,_false>._M_head_impl = this_01;
    if (pvVar2 != (vss_store_body_t *)0x0) {
      (**(code **)((long)(pvVar2->super_kstruct)._vptr_kstruct + 8))();
    }
    return;
  }
  this_02 = (validation_expr_error<unsigned_int> *)__cxa_allocate_exception(0x40);
  local_60._M_dataplus._M_p._0_4_ = this->m_vss_size;
  pkVar1 = (this->super_kstruct).m__io;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"/seq/1","");
  kaitai::validation_expr_error<unsigned_int>::validation_expr_error
            (this_02,(uint *)&local_60,pkVar1,&local_40);
  __cxa_throw(this_02,&kaitai::validation_expr_error<unsigned_int>::typeinfo,
              kaitai::kstruct_error::~kstruct_error);
}

Assistant:

void edk2_vss_t::_read() {
    m_signature = m__io->read_u4le();
    m_vss_size = m__io->read_u4le();
    {
        uint32_t _ = vss_size();
        if (!( ((_ > static_cast<uint32_t>(len_vss_store_header())) && (_ < 4294967295UL)) )) {
            throw kaitai::validation_expr_error<uint32_t>(vss_size(), _io(), std::string("/seq/1"));
        }
    }
    m_format = m__io->read_u1();
    m_state = m__io->read_u1();
    m_reserved = m__io->read_u2le();
    m_reserved1 = m__io->read_u4le();
    m__raw_body = m__io->read_bytes((vss_size() - len_vss_store_header()));
    m__io__raw_body = std::unique_ptr<kaitai::kstream>(new kaitai::kstream(m__raw_body));
    m_body = std::unique_ptr<vss_store_body_t>(new vss_store_body_t(m__io__raw_body.get(), this, m__root));
}